

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_pyr.h
# Opt level: O2

Image<unsigned_short> * __thiscall
vo::ManagedImagePyr<unsigned_short,_std::allocator<unsigned_short>_>::lvl_internal
          (ManagedImagePyr<unsigned_short,_std::allocator<unsigned_short>_> *this,size_t lvl)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  unsigned_short *puVar4;
  byte bVar5;
  Image<unsigned_short> *in_RDI;
  ulong uVar6;
  ulong uVar7;
  
  bVar5 = (byte)lvl;
  uVar1 = this->orig_w;
  uVar6 = uVar1;
  if (lvl == 0) {
    uVar6 = 0;
  }
  uVar2 = (this->image).super_Image<unsigned_short>.h;
  sVar3 = (this->image).super_Image<unsigned_short>.pitch;
  uVar7 = uVar2 - (uVar2 >> (bVar5 - 1 & 0x3f));
  if (lvl < 2) {
    uVar7 = 0;
  }
  puVar4 = (this->image).super_Image<unsigned_short>.ptr;
  in_RDI->pitch = sVar3;
  in_RDI->ptr = (unsigned_short *)((long)puVar4 + uVar6 * 2 + uVar7 * sVar3);
  in_RDI->w = uVar1 >> (bVar5 & 0x3f);
  in_RDI->h = uVar2 >> (bVar5 & 0x3f);
  return in_RDI;
}

Assistant:

inline Image<T> lvl_internal(size_t lvl) {
    size_t x = (lvl == 0) ? 0 : orig_w;
    size_t y = (lvl <= 1) ? 0 : (image.h - (image.h >> (lvl - 1)));
    size_t width = (orig_w >> lvl);
    size_t height = (image.h >> lvl);

    return image.SubImage(x, y, width, height);
  }